

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int optimize_scope_make_global_ref
              (JSContext *ctx,JSFunctionDef *s,DynBuf *bc,uint8_t *bc_buf,LabelSlot *ls,int pos_next
              ,JSAtom var_name)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  JSAtomStruct *pJVar4;
  int iVar5;
  ulong uVar6;
  uint8_t uVar7;
  JSAtom local_38;
  JSAtom local_34;
  
  bVar1 = s->js_mode;
  if ((bVar1 & 1) != 0) {
    dbuf_putc(bc,'6');
    if (0xd1 < (int)var_name) {
      pJVar4 = ctx->rt->atom_array[var_name];
      (pJVar4->header).ref_count = (pJVar4->header).ref_count + 1;
    }
    local_38 = var_name;
    dbuf_put(bc,(uint8_t *)&local_38,4);
  }
  if (bc_buf[pos_next] == '<') {
    dbuf_putc(bc,'8');
    if (0xd1 < (int)var_name) {
      pJVar4 = ctx->rt->atom_array[var_name];
      (pJVar4->header).ref_count = (pJVar4->header).ref_count + 1;
    }
    local_34 = var_name;
    dbuf_put(bc,(uint8_t *)&local_34,4);
    pos_next = pos_next + 1;
  }
  iVar3 = ls->pos;
  uVar6 = (long)iVar3 - 5;
  bVar2 = bc_buf[iVar3];
  if ((bVar1 & 1) == 0) {
    uVar7 = '\x11';
    if (bVar2 != 0x16) goto LAB_00161aad;
  }
  else if (bVar2 < 0x1d) {
    uVar7 = '\x15';
    if (bVar2 != 0x16) {
      if (bVar2 != 0x19) {
LAB_00161a9e:
        abort();
      }
      uVar7 = '\x18';
    }
  }
  else {
    if (bVar2 != 0x1d) {
      if (bVar2 != 0xb1) goto LAB_00161a9e;
      goto LAB_00161aad;
    }
    uVar7 = '\x1b';
  }
  bc_buf[uVar6] = uVar7;
  uVar6 = (ulong)(iVar3 - 4);
LAB_00161aad:
  iVar5 = (int)uVar6;
  bc_buf[iVar5] = (bVar1 & 1) * '\x02' | 0x39;
  if (0xd1 < (int)var_name) {
    pJVar4 = ctx->rt->atom_array[var_name];
    (pJVar4->header).ref_count = (pJVar4->header).ref_count + 1;
  }
  *(JSAtom *)(bc_buf + (long)iVar5 + 1) = var_name;
  if (iVar5 + 3 < iVar3) {
    memset(bc_buf + (long)iVar5 + 5,0xb1,(ulong)((iVar3 - iVar5) - 4) + 1);
  }
  return pos_next;
}

Assistant:

static int optimize_scope_make_global_ref(JSContext *ctx, JSFunctionDef *s,
                                          DynBuf *bc, uint8_t *bc_buf,
                                          LabelSlot *ls, int pos_next,
                                          JSAtom var_name)
{
    int label_pos, end_pos, pos, op;
    BOOL is_strict;
    is_strict = ((s->js_mode & JS_MODE_STRICT) != 0);

    /* replace the reference get/put with normal variable
       accesses */
    if (is_strict) {
        /* need to check if the variable exists before evaluating the right
           expression */
        /* XXX: need an extra OP_true if destructuring an array */
        dbuf_putc(bc, OP_check_var);
        dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
    } else {
        /* XXX: need 2 extra OP_true if destructuring an array */
    }
    if (bc_buf[pos_next] == OP_get_ref_value) {
        dbuf_putc(bc, OP_get_var);
        dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
        pos_next++;
    }
    /* remove the OP_label to make room for replacement */
    /* label should have a refcount of 0 anyway */
    /* XXX: should have emitted several OP_nop to avoid this kludge */
    label_pos = ls->pos;
    pos = label_pos - 5;
    assert(bc_buf[pos] == OP_label);
    end_pos = label_pos + 2;
    op = bc_buf[label_pos];
    if (is_strict) {
        if (op != OP_nop) {
            switch(op) {
            case OP_insert3:
                op = OP_insert2;
                break;
            case OP_perm4:
                op = OP_perm3;
                break;
            case OP_rot3l:
                op = OP_swap;
                break;
            default:
                abort();
            }
            bc_buf[pos++] = op;
        }
    } else {
        if (op == OP_insert3)
            bc_buf[pos++] = OP_dup;
    }
    if (is_strict) {
        bc_buf[pos] = OP_put_var_strict;
        /* XXX: need 1 extra OP_drop if destructuring an array */
    } else {
        bc_buf[pos] = OP_put_var;
        /* XXX: need 2 extra OP_drop if destructuring an array */
    }
    put_u32(bc_buf + pos + 1, JS_DupAtom(ctx, var_name));
    pos += 5;
    /* pad with OP_nop */
    while (pos < end_pos)
        bc_buf[pos++] = OP_nop;
    return pos_next;
}